

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

void __thiscall
qclab::QCircuit<double,_qclab::QObject<double>_>::apply
          (QCircuit<double,_qclab::QObject<double>_> *this,Op op,int nbQubits,
          vector<double,_std::allocator<double>_> *vector,int offset)

{
  QObject<double> *pQVar1;
  pointer puVar2;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>_>
  __tmp;
  
  if (op == NoTrans) {
    for (puVar2 = (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      pQVar1 = (puVar2->_M_t).
               super___uniq_ptr_impl<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::QObject<double>_*,_std::default_delete<qclab::QObject<double>_>_>
               .super__Head_base<0UL,_qclab::QObject<double>_*,_false>._M_head_impl;
      (*pQVar1->_vptr_QObject[8])
                (pQVar1,0x4e,(ulong)(uint)nbQubits,vector,(ulong)(uint)(this->offset_ + offset));
    }
  }
  else {
    puVar2 = (this->gates_).
             super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 != (this->gates_).
                  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pQVar1 = puVar2[-1]._M_t.
                 super___uniq_ptr_impl<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::QObject<double>_*,_std::default_delete<qclab::QObject<double>_>_>
                 .super__Head_base<0UL,_qclab::QObject<double>_*,_false>._M_head_impl;
        puVar2 = puVar2 + -1;
        (*pQVar1->_vptr_QObject[8])
                  (pQVar1,(ulong)(uint)(int)(char)op,(ulong)(uint)nbQubits,vector,
                   (ulong)(uint)(this->offset_ + offset));
      } while (puVar2 != (this->gates_).
                         super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void apply( Op op , const int nbQubits , std::vector< T >& vector ,
                  const int offset = 0 ) const override {
        if ( op == Op::NoTrans ) {
          // NoTrans
          for ( auto it = begin(); it != end(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        } else {
          // [Conj]Trans
          for ( auto it = rbegin(); it != rend(); ++it ) {
            (*it)->apply( op , nbQubits , vector , offset_ + offset ) ;
          }
        }
      }